

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O0

int file_truncate(int handle,LONGLONG filesize)

{
  int __fd;
  __off64_t in_RSI;
  int in_EDI;
  int fdesc;
  undefined4 in_stack_ffffffffffffffe8;
  
  __fd = fileno((FILE *)handleTable[in_EDI].fileptr);
  ftruncate64(__fd,in_RSI);
  file_seek((int)in_RSI,CONCAT44(__fd,in_stack_ffffffffffffffe8));
  handleTable[in_EDI].currentpos = in_RSI;
  handleTable[in_EDI].last_io_op = 0;
  return 0;
}

Assistant:

int file_truncate(int handle, LONGLONG filesize)
/*
  truncate the diskfile to a new smaller size
*/
{

#ifdef HAVE_FTRUNCATE
    int fdesc;

    fdesc = fileno(handleTable[handle].fileptr);
    ftruncate(fdesc, (OFF_T) filesize);
    file_seek(handle, filesize);

    handleTable[handle].currentpos = filesize;
    handleTable[handle].last_io_op = IO_SEEK;

#endif

    return(0);
}